

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void DestroyMinimumPhaseAnalysis(MinimumPhaseAnalysis *minimum_phase)

{
  fft_plan p;
  fft_plan p_00;
  double *in_stack_ffffffffffffff40;
  undefined1 local_a0 [8];
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  MinimumPhaseAnalysis *local_10;
  MinimumPhaseAnalysis *minimum_phase_local;
  
  local_10 = minimum_phase;
  memcpy(local_58,&minimum_phase->forward_fft,0x48);
  p._8_8_ = local_48;
  p.n = (undefined4)uStack_50;
  p.sign = uStack_50._4_4_;
  p.c_in = (fft_complex *)uStack_40;
  p.in = (double *)local_38;
  p.c_out = (fft_complex *)uStack_30;
  p.out = (double *)local_28;
  p.input = (double *)uStack_20;
  p.ip = (int *)local_18;
  p.w = in_stack_ffffffffffffff40;
  fft_destroy_plan(p);
  memcpy(local_a0,&local_10->inverse_fft,0x48);
  p_00._8_8_ = local_90;
  p_00.n = (undefined4)uStack_98;
  p_00.sign = uStack_98._4_4_;
  p_00.c_in = (fft_complex *)uStack_88;
  p_00.in = (double *)local_80;
  p_00.c_out = (fft_complex *)uStack_78;
  p_00.out = (double *)local_70;
  p_00.input = (double *)uStack_68;
  p_00.ip = (int *)local_60;
  p_00.w = in_stack_ffffffffffffff40;
  fft_destroy_plan(p_00);
  if (local_10->cepstrum != (fft_complex *)0x0) {
    operator_delete__(local_10->cepstrum);
  }
  if (local_10->log_spectrum != (double *)0x0) {
    operator_delete__(local_10->log_spectrum);
  }
  if (local_10->minimum_phase_spectrum != (fft_complex *)0x0) {
    operator_delete__(local_10->minimum_phase_spectrum);
  }
  return;
}

Assistant:

void DestroyMinimumPhaseAnalysis(MinimumPhaseAnalysis *minimum_phase) {
  fft_destroy_plan(minimum_phase->forward_fft);
  fft_destroy_plan(minimum_phase->inverse_fft);
  delete[] minimum_phase->cepstrum;
  delete[] minimum_phase->log_spectrum;
  delete[] minimum_phase->minimum_phase_spectrum;
}